

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int tree_5_3::toThread(Btree t,Btree pre)

{
  code *pcVar1;
  Btree pre_local;
  Btree t_local;
  
  if (t != (Btree)0x0) {
    toThread(t->left,pre);
    if (t->left == (node *)0x0) {
      t->left = pre;
      t->ltag = 1;
    }
    if ((pre != (Btree)0x0) && (pre->right == (node *)0x0)) {
      pre->right = t;
      pre->rtag = 1;
    }
    toThread(t->right,t);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int toThread(Btree t, Btree pre) {
        if (t != nullptr) {
            toThread(t->left, pre);
            if (t->left == nullptr) {
                t->left = pre;
                t->ltag = 1;
            }
            if (pre != nullptr && pre->right == nullptr) {
                pre->right = t;
                pre->rtag = 1;
            }
            pre = t;
            toThread(t->right, pre);
        }
    }